

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O2

RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> * __thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::set
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,int *key,
          WeightedGraphAdjSet<int,_int> *value)

{
  int iVar1;
  int iVar2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar3;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar4;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node;
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> TStack_68;
  
  pRVar3 = this->_root;
  if (pRVar3 == (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 *)0x0) {
    pRVar3 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::TreeElement
              (&TStack_68,key,value);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::RBTreeNode(pRVar3,&TStack_68);
    this->_root = pRVar3;
    WeightedGraphAdjSet<int,_int>::~WeightedGraphAdjSet(&TStack_68.value);
  }
  else {
    node = pRVar3->_parent;
    while (pRVar4 = pRVar3,
          pRVar4 != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                     *)0x0) {
      iVar1 = (pRVar4->element).key;
      if (iVar1 == *key) {
        WeightedGraphAdjSet<int,_int>::operator=(&(pRVar4->element).value,value);
        return this;
      }
      node = pRVar4;
      pRVar3 = (&pRVar4->_left)[iVar1 <= *key];
    }
    pRVar3 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::TreeElement
              (&TStack_68,key,value);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::RBTreeNode(pRVar3,&TStack_68);
    WeightedGraphAdjSet<int,_int>::~WeightedGraphAdjSet(&TStack_68.value);
    iVar2 = *key;
    iVar1 = (node->element).key;
    (&node->_left)[iVar1 <= iVar2] = pRVar3;
    pRVar3->_parent = node;
    pRVar3->_is_left = iVar2 < iVar1;
    pRVar3->_is_red = true;
    while (node != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                    *)0x0) {
      node->node_count = node->node_count + 1;
      pRVar3 = _balance(this,node);
      node = pRVar3->_parent;
    }
    if (this->_root->_is_red == true) {
      this->_root->_is_red = false;
    }
  }
  return this;
}

Assistant:

inline
    RBTree<Key, Value>& RBTree<Key, Value>::set(const Key &key, const Value &value){
        if (isEmpty()) {
            _root = new RBTreeNode<TreeElement<Key, Value>>(TreeElement<Key, Value>(key, value));
            return *this;
        }
        auto node = _root;
        auto parent = _root->parent();
        while (node != nullptr) {
            if (node->element.key == key) {
                node->element.value = value;
                return *this;
            }
            parent = node;
            if (key < node->element.key) {
                node = node->left();
            } else {
                node = node->right();
            }
        }
        node = new RBTreeNode<TreeElement<Key, Value>>(TreeElement<Key, Value>(key, value));
        if (key < parent->element.key) {
            parent->insertLeft(node, true);
        } else {
            parent->insertRight(node, true);
        }
        while (parent != nullptr) {
            parent->node_count++;
            parent = _balance(parent)->parent();
        }
        // reset the root's color
        if (_root->isRed()) {
            _root->flipColors();
        }
        return *this;
    }